

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.cpp
# Opt level: O0

int __thiscall
axl::io::psx::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  undefined4 in_register_00000034;
  int socket;
  socklen_t addrSize;
  socklen_t *local_30;
  socklen_t local_14;
  sockaddr *local_10;
  Socket *local_8;
  
  local_10 = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  local_14 = 0x1c;
  if (local_10 == (sockaddr *)0x0) {
    local_30 = (socklen_t *)0x0;
  }
  else {
    local_30 = &local_14;
  }
  local_8 = this;
  ::accept((this->super_File).super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
           m_h,local_10,local_30);
  iVar1 = err::complete<int>(0,0x17539d);
  return iVar1;
}

Assistant:

int
Socket::accept(SockAddr* addr) {
	socklen_t addrSize = sizeof(SockAddr);
	int socket = ::accept(
		m_h,
		(sockaddr*)addr,
		addr ? &addrSize : NULL
	);

	return err::complete(socket, -1);
}